

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::CreateSynchWaitController
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CObjectType *potObjectType,
          VOID *pvSynchData,ObjectDomain odObjectDomain,ISynchWaitController **ppWaitController)

{
  CSynchWaitController *pCVar1;
  PAL_ERROR PVar2;
  
  if (odObjectDomain == SharedObject) {
    pvSynchData = SHMPtrToPtr((SHMPTR)pvSynchData);
  }
  pCVar1 = CSynchCache<CorUnix::CSynchWaitController>::Get(&this->m_cacheWaitCtrlrs,pthrCurrent);
  if (pCVar1 == (CSynchWaitController *)0x0) {
    PVar2 = 8;
  }
  else {
    PVar2 = 0;
    CSynchControllerBase::Init
              (&pCVar1->super_CSynchControllerBase,pthrCurrent,WaitController,odObjectDomain,
               potObjectType,(CSynchData *)pvSynchData,(uint)(odObjectDomain == SharedObject) * 2);
    *ppWaitController = &pCVar1->super_ISynchWaitController;
  }
  return PVar2;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::CreateSynchWaitController(
        CPalThread *pthrCurrent,
        CObjectType *potObjectType,
        VOID *pvSynchData,
        ObjectDomain odObjectDomain,
        ISynchWaitController **ppWaitController)
    {
        PAL_ERROR palErr = NO_ERROR;
        CSynchWaitController * pCtrlr =  NULL;
        WaitDomain wdWaitDomain = (SharedObject == odObjectDomain) ? SharedWait : LocalWait;
        CSynchData * psdSynchData;

        psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
            CSynchData, reinterpret_cast<SharedID>(pvSynchData)) :
            static_cast<CSynchData *>(pvSynchData);

        VALIDATEOBJECT(psdSynchData);

        pCtrlr = m_cacheWaitCtrlrs.Get(pthrCurrent);
        if (NULL == pCtrlr)
        {
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto CSWC_exit;
        }

        pCtrlr->Init(pthrCurrent,
                     CSynchControllerBase::WaitController,
                     odObjectDomain,
                     potObjectType,
                     psdSynchData,
                     wdWaitDomain);

        // Succeeded
        *ppWaitController = (ISynchWaitController *)pCtrlr;

    CSWC_exit:
        if ((NO_ERROR != palErr) && (NULL != pCtrlr))
        {
            m_cacheWaitCtrlrs.Add(pthrCurrent, pCtrlr);
        }
        return palErr;
    }